

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

CourseComponent *
buildGraph(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
           *courses,bool debugOn)

{
  CourseComponent **root;
  Course *this;
  CourseComponent *pCVar1;
  _Hash_node_base *p_Var2;
  value_type course;
  string local_b8;
  string local_98;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *local_38;
  
  this = (Course *)operator_new(0x88);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Course Planner Root","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  Course::Course(this,&local_78,0,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  p_Var2 = (courses->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,p_Var2[1]._M_nxt,
                 (long)&(p_Var2[1]._M_nxt)->_M_nxt + (long)&(p_Var2[2]._M_nxt)->_M_nxt);
      local_38 = (vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)p_Var2[5]._M_nxt;
      root = (local_38->super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
      if (root != (local_38->
                  super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
        pCVar1 = buildGraph(root,local_38,courses,debugOn);
        (*(this->super_CourseComponent).super_Observer._vptr_Observer[1])(this,pCVar1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return &this->super_CourseComponent;
}

Assistant:

CourseComponent* buildGraph(const unordered_map<string, vector<CourseComponent*>*>& courses, bool debugOn) {
    
    CourseComponent* root = new Course("Course Planner Root", 0, "", "");
    
    for (auto course : courses) {
        vector<CourseComponent*>* cList = course.second;
        if (!cList->empty()) {
            root->add(buildGraph(&cList->at(0), cList, courses, debugOn));
        }
    }

    return root;
}